

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O0

string * kaitai::kstream::bytes_terminate
                   (string *__return_storage_ptr__,string *src,char term,bool include)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  size_t max_len;
  size_t new_len;
  bool include_local;
  char term_local;
  string *src_local;
  
  max_len = 0;
  uVar1 = std::__cxx11::string::length();
  while( true ) {
    bVar3 = false;
    if (max_len < uVar1) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)src);
      bVar3 = *pcVar2 != term;
    }
    if (!bVar3) break;
    max_len = max_len + 1;
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)src);
  return __return_storage_ptr__;
}

Assistant:

std::string kaitai::kstream::bytes_terminate(std::string src, char term, bool include) {
    std::size_t new_len = 0;
    std::size_t max_len = src.length();

    while (new_len < max_len && src[new_len] != term)
        new_len++;

    if (include && new_len < max_len)
        new_len++;

    return src.substr(0, new_len);
}